

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc_cord_state.h
# Opt level: O2

Rep * __thiscall absl::crc_internal::CrcCordState::mutable_rep(CrcCordState *this)

{
  RefcountedRep *this_00;
  
  if ((this->refcounted_rep_->count).super___atomic_base<int>._M_i == 1) {
    this_00 = this->refcounted_rep_;
  }
  else {
    this_00 = (RefcountedRep *)operator_new(0x68);
    RefcountedRep::RefcountedRep(this_00);
    Rep::operator=(&this_00->rep,&this->refcounted_rep_->rep);
    Unref(this->refcounted_rep_);
    this->refcounted_rep_ = this_00;
  }
  return &this_00->rep;
}

Assistant:

Rep* mutable_rep() {
    if (refcounted_rep_->count.load(std::memory_order_acquire) != 1) {
      RefcountedRep* copy = new RefcountedRep;
      copy->rep = refcounted_rep_->rep;
      Unref(refcounted_rep_);
      refcounted_rep_ = copy;
    }
    return &refcounted_rep_->rep;
  }